

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::setEnabled_helper(QWidgetPrivate *this,bool enable)

{
  long lVar1;
  ulong uVar2;
  undefined1 *puVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  long lVar9;
  qsizetype qVar10;
  QFlags_conflict1 *pQVar11;
  QFlags<Qt::InputMethodQuery> *this_00;
  byte in_SIL;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *focusWidget;
  QWidget *w;
  int i;
  WidgetAttribute attribute;
  bool parentIsEnabled;
  QWidget *q;
  QEvent e;
  undefined4 in_stack_ffffffffffffff78;
  InputMethodQuery in_stack_ffffffffffffff7c;
  QWidgetPrivate *in_stack_ffffffffffffff80;
  QWidget *in_stack_ffffffffffffff88;
  QWidget *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffb0;
  int local_44;
  undefined7 in_stack_ffffffffffffffd0;
  QEvent local_20 [3];
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = in_SIL & 1;
  pQVar7 = q_func(in_RDI);
  if ((((bVar4 & 1) != 0) &&
      (bVar5 = QWidget::isWindow((QWidget *)in_stack_ffffffffffffff80), !bVar5)) &&
     (pQVar8 = QWidget::parentWidget((QWidget *)0x36933d), pQVar8 != (QWidget *)0x0)) {
    QWidget::parentWidget((QWidget *)0x36934d);
    bVar5 = QWidget::isEnabled((QWidget *)0x369355);
    if (!bVar5) goto LAB_003695f7;
  }
  uVar6 = (uint)(bVar4 & 1);
  bVar5 = QWidget::testAttribute
                    (in_stack_ffffffffffffff88,
                     (WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  puVar3 = _local_20;
  if (uVar6 == bVar5) {
    uVar2 = (ulong)_local_20 >> 0x20;
    QWidget::setAttribute
              (in_stack_ffffffffffffffe8,(WidgetAttribute)uVar2,SUB81((ulong)puVar3 >> 0x18,0));
    updateSystemBackground(in_RDI);
    if ((bVar4 & 1) == 0) {
      QWidget::window(in_stack_ffffffffffffff90);
      pQVar8 = QWidget::focusWidget((QWidget *)0x3693c9);
      if (pQVar8 == pQVar7) {
        pQVar8 = QWidget::parentWidget((QWidget *)0x3693da);
        in_stack_ffffffffffffff98 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
        if (pQVar8 != (QWidget *)0x0) {
          QWidget::parentWidget((QWidget *)0x3693f3);
          bVar5 = QWidget::isEnabled((QWidget *)0x3693fb);
          in_stack_ffffffffffffff98 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffff98);
        }
        if (((char)((uint)in_stack_ffffffffffffff98 >> 0x18) == '\0') ||
           (bVar5 = QWidget::focusNextChild((QWidget *)0x36941a), !bVar5)) {
          QWidget::clearFocus(in_stack_ffffffffffffffb0);
        }
      }
    }
    local_44 = 0;
    while( true ) {
      lVar9 = (long)local_44;
      qVar10 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
      if (qVar10 <= lVar9) break;
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_ffffffffffffff80,
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      pQVar8 = qobject_cast<QWidget*>
                         ((QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if ((pQVar8 != (QWidget *)0x0) &&
         (bVar5 = QWidget::testAttribute
                            (in_stack_ffffffffffffff88,
                             (WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20)), !bVar5))
      {
        QWidget::d_func((QWidget *)0x3694b0);
        setEnabled_helper((QWidgetPrivate *)CONCAT17(bVar4,in_stack_ffffffffffffffd0),
                          SUB81((ulong)pQVar7 >> 0x38,0));
      }
      local_44 = local_44 + 1;
    }
    bVar5 = QWidget::testAttribute
                      (in_stack_ffffffffffffff88,
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    if ((bVar5) || (bVar5 = QWidget::isWindow((QWidget *)in_stack_ffffffffffffff80), bVar5)) {
      qt_qpa_set_cursor((QWidget *)in_RDI,SUB41(uVar6 >> 0x18,0));
    }
    bVar5 = QWidget::testAttribute
                      (in_stack_ffffffffffffff88,
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    if ((bVar5) &&
       (bVar5 = QWidget::hasFocus((QWidget *)CONCAT44(uVar6,in_stack_ffffffffffffff98)), bVar5)) {
      effectiveFocusWidget(in_stack_ffffffffffffff80);
      if ((bVar4 & 1) == 0) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
        this_00 = (QFlags<Qt::InputMethodQuery> *)QGuiApplication::inputMethod();
        QFlags<Qt::InputMethodQuery>::QFlags(this_00,in_stack_ffffffffffffff7c);
        QInputMethod::update((QFlags_conflict1 *)this_00);
      }
      else {
        bVar5 = QWidget::testAttribute
                          (in_stack_ffffffffffffff88,
                           (WidgetAttribute)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        if (bVar5) {
          pQVar11 = (QFlags_conflict1 *)QGuiApplication::inputMethod();
          QFlags<Qt::InputMethodQuery>::QFlags
                    ((QFlags<Qt::InputMethodQuery> *)in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c);
          QInputMethod::update(pQVar11);
        }
      }
    }
    _local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent(local_20,EnabledChange);
    QCoreApplication::sendEvent(&pQVar7->super_QObject,local_20);
    QEvent::~QEvent(local_20);
  }
LAB_003695f7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setEnabled_helper(bool enable)
{
    Q_Q(QWidget);

    if (enable && !q->isWindow() && q->parentWidget() && !q->parentWidget()->isEnabled())
        return; // nothing we can do

    if (enable != q->testAttribute(Qt::WA_Disabled))
        return; // nothing to do

    q->setAttribute(Qt::WA_Disabled, !enable);
    updateSystemBackground();

    if (!enable && q->window()->focusWidget() == q) {
        bool parentIsEnabled = (!q->parentWidget() || q->parentWidget()->isEnabled());
        if (!parentIsEnabled || !q->focusNextChild())
            q->clearFocus();
    }

    Qt::WidgetAttribute attribute = enable ? Qt::WA_ForceDisabled : Qt::WA_Disabled;
    for (int i = 0; i < children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(children.at(i));
        if (w && !w->testAttribute(attribute))
            w->d_func()->setEnabled_helper(enable);
    }
#ifndef QT_NO_CURSOR
    if (q->testAttribute(Qt::WA_SetCursor) || q->isWindow()) {
        // enforce the windows behavior of clearing the cursor on
        // disabled widgets
        qt_qpa_set_cursor(q, false);
    }
#endif
#ifndef QT_NO_IM
    if (q->testAttribute(Qt::WA_InputMethodEnabled) && q->hasFocus()) {
        QWidget *focusWidget = effectiveFocusWidget();

        if (enable) {
            if (focusWidget->testAttribute(Qt::WA_InputMethodEnabled))
                QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        } else {
            QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
    }
#endif //QT_NO_IM
    QEvent e(QEvent::EnabledChange);
    QCoreApplication::sendEvent(q, &e);
}